

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  char *pcVar1;
  bool bVar2;
  address local_598;
  string local_578;
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  char msg [1299];
  
  bVar2 = (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.base.sa_family !=
          2;
  if (bVar2) {
    local_598.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8);
    local_598.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x10);
    local_598.ipv6_address_.scope_id_ =
         (unsigned_long)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.sin6_scope_id;
    local_598.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_598.ipv4_address_.addr_.s_addr =
         (in4_addr_type)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v4.sin_addr.s_addr;
    local_598.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_598.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_598.ipv6_address_.scope_id_ = 0;
  }
  local_598.type_ = (anon_enum_32)bVar2;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_578,&local_598);
  if (this->m_response_size == 0) {
    snprintf(msg,0x513,"DHT direct response (address=%s) [ %s ]",local_578._M_dataplus._M_p,"");
  }
  else {
    pcVar1 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_response_idx).m_idx);
    local_558[0] = local_548;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_558,pcVar1,pcVar1 + this->m_response_size);
    snprintf(msg,0x513,"DHT direct response (address=%s) [ %s ]",local_578._M_dataplus._M_p,
             local_558[0]);
    std::__cxx11::string::~string((string *)local_558);
  }
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,msg,(allocator<char> *)&local_578);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
	}